

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(const_std::error_code_&)>::callback<sock1>
          (callback<void_(const_std::error_code_&)> *this,sock1 func)

{
  callable<void_(const_std::error_code_&)> *this_00;
  
  this_00 = (callable<void_(const_std::error_code_&)> *)operator_new(0x28);
  callable<void_(const_std::error_code_&)>::callable(this_00);
  (this_00->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_00109a30;
  this_00[1].super_refcounted._vptr_refcounted = (_func_int **)func._0_8_;
  *(io_service **)&this_00[1].super_refcounted.refs_ = func.srv;
  this_00[2].super_refcounted._vptr_refcounted = (_func_int **)func._16_8_;
  (this->call_ptr).p_ = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}